

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_init.c
# Opt level: O2

void comm_test(MPI_Comm comm)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int g_a;
  int iVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  char *__s;
  uint uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int ld;
  int lo [2];
  int hi [2];
  int rank;
  int dims [2];
  
  MPI_Comm_rank(comm,&rank);
  iVar4 = GA_Initialize_comm(comm);
  if (iVar4 != 0) {
    uVar5 = GA_Nodeid();
    uVar6 = GA_Nnodes();
    if (uVar5 == 0) {
      printf("\nRunning comm_test on %d processors\n\n",(ulong)uVar6);
    }
    g_a = NGA_Create_handle();
    dims[0] = 0x100;
    dims[1] = 0x100;
    NGA_Set_data(g_a,2,dims,0x3ec);
    NGA_Allocate(g_a);
    GA_Zero(g_a);
    NGA_Distribution(g_a,(int)(uVar5 + 1) % (int)uVar6,lo,hi);
    iVar7 = lo[1];
    iVar4 = lo[0];
    lVar10 = (long)hi[0];
    lVar12 = (long)lo[0];
    lVar16 = (long)hi[1];
    lVar15 = (long)lo[1];
    iVar17 = (hi[1] - lo[1]) + 1;
    ld = iVar17;
    pvVar8 = malloc((long)(((hi[0] - lo[0]) + 1) * iVar17) << 3);
    iVar7 = iVar4 * 0x100 + iVar7;
    iVar4 = 0;
    for (; lVar13 = lVar15, iVar1 = iVar7, iVar2 = iVar4, lVar12 <= lVar10; lVar12 = lVar12 + 1) {
      for (; lVar13 <= lVar16; lVar13 = lVar13 + 1) {
        *(double *)((long)pvVar8 + (long)iVar2 * 8) = (double)iVar1;
        iVar1 = iVar1 + 1;
        iVar2 = iVar2 + 1;
      }
      iVar4 = iVar4 + iVar17;
      iVar7 = iVar7 + 0x100;
    }
    NGA_Put(g_a,lo,hi,pvVar8,&ld);
    GA_Sync();
    free(pvVar8);
    if (0 < (int)uVar5) {
      uVar6 = uVar5;
    }
    NGA_Distribution(g_a,uVar6 - 1,lo,hi);
    ld = (hi[1] - lo[1]) + 1;
    uVar6 = ((hi[0] - lo[0]) + 1) * ld;
    pvVar8 = malloc((long)(int)uVar6 * 8);
    uVar9 = 0;
    uVar11 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar11 = uVar9;
    }
    for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      *(undefined8 *)((long)pvVar8 + uVar9 * 8) = 0;
    }
    NGA_Get(g_a,lo,hi,pvVar8,&ld);
    iVar4 = lo[0] << 8;
    bVar3 = true;
    for (uVar6 = lo[0]; (int)uVar6 <= hi[0]; uVar6 = uVar6 + 1) {
      iVar7 = uVar6 - lo[0];
      for (uVar14 = lo[1]; (int)uVar14 <= hi[1]; uVar14 = uVar14 + 1) {
        if (bVar3 && (double)(int)(iVar4 + uVar14) !=
                     *(double *)((long)pvVar8 + (long)(int)((ld * iVar7 - lo[1]) + uVar14) * 8)) {
          printf("p[%d] Mismatch for (%d,%d) expected: %f actual: %f\n",(ulong)uVar5,(ulong)uVar6,
                 (ulong)uVar14);
          bVar3 = false;
        }
      }
      iVar4 = iVar4 + 0x100;
    }
    free(pvVar8);
    if (!bVar3 || uVar5 == 0) {
      __s = "Test passed";
      if (!bVar3) {
        __s = "Test failed";
      }
      if (uVar5 != 0) {
        __s = "Test failed";
      }
      puts(__s);
    }
    GA_Terminate();
  }
  return;
}

Assistant:

void comm_test(MPI_Comm comm)
{
  double *buf;
  int i, j, ii, jj, ld;
  int lo[2], hi[2];
  int dims[2];
  int two = 2;
  int g_a;
  int me, nprocs, prem;
  int nelems, ok;
  int rank;
  MPI_Comm_rank(comm,&rank);
  if (GA_Initialize_comm(comm)) {
    me = GA_Nodeid();
    nprocs = GA_Nnodes();
    prem = (me+1)%nprocs;
    if (me == 0) {
      printf("\nRunning comm_test on %d processors\n\n",nprocs);
    }

    g_a = NGA_Create_handle();
    dims[0] = DIM;
    dims[1] = DIM;
    NGA_Set_data(g_a,two,dims,C_DBL);
    NGA_Allocate(g_a);
    GA_Zero(g_a);

    /* Find out what section of global array I'm writing to */
    NGA_Distribution(g_a,prem,lo,hi);
    nelems = (hi[0]-lo[0]+1)*(hi[1]-lo[1]+1);
    ld = hi[1]-lo[1]+1;
    buf = (double*)malloc(nelems*sizeof(double));
    for (i=lo[0]; i<=hi[0]; i++) {
      ii = i-lo[0];
      for (j=lo[1]; j<=hi[1]; j++) {
        jj = j-lo[1];
        buf[ii*ld+jj] = (double)(i*DIM+j);
      }
    }
    NGA_Put(g_a,lo,hi,buf,&ld);
    GA_Sync();
    free(buf);
    /* Copy data from a different section of global array and check values */
    prem = me-1;
    if (prem < 0) prem = nprocs-1;
    NGA_Distribution(g_a,prem,lo,hi);
    nelems = (hi[0]-lo[0]+1)*(hi[1]-lo[1]+1);
    ld = hi[1]-lo[1]+1;
    buf = (double*)malloc(nelems*sizeof(double));
    for (i=0; i<nelems; i++) buf[i] = 0.0;
    NGA_Get(g_a,lo,hi,buf,&ld);

    ok = 1;
    for (i=lo[0]; i<=hi[0]; i++) {
      ii = i-lo[0];
      for (j=lo[1]; j<=hi[1]; j++) {
        jj = j-lo[1];
        if (buf[ii*ld+jj] != (double)(i*DIM+j)) {
          if (ok == 1) {
            printf("p[%d] Mismatch for (%d,%d) expected: %f actual: %f\n",
                me,i,j,buf[ii*ld+jj],(double)(i*DIM+j));
            ok = 0;
          }
        }
      }
    }
    free(buf);
    if (me == 0 && ok) {
      printf("Test passed\n");
    } else if (!ok) {
      printf("Test failed\n");
    }
    GA_Terminate();
  }
}